

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::MergeFrom
          (RandomUniformLikeLayerParams *this,RandomUniformLikeLayerParams *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe38c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from->seed_ != 0) {
    this->seed_ = from->seed_;
  }
  fVar1 = from->minval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->minval_ = fVar1;
  }
  fVar1 = from->maxval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->maxval_ = fVar1;
  }
  return;
}

Assistant:

void RandomUniformLikeLayerParams::MergeFrom(const RandomUniformLikeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.RandomUniformLikeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.seed() != 0) {
    set_seed(from.seed());
  }
  if (from.minval() != 0) {
    set_minval(from.minval());
  }
  if (from.maxval() != 0) {
    set_maxval(from.maxval());
  }
}